

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

float collision_cleanup(features *fs)

{
  float *pfVar1;
  float *pfVar2;
  unsigned_long *puVar3;
  unsigned_long uVar4;
  iterator pos;
  features_value_iterator local_18;
  unsigned_long *local_10;
  float local_4;
  
  pfVar2 = (fs->values)._begin;
  puVar3 = (fs->indicies)._begin;
  pfVar1 = (fs->values)._end;
  local_4 = 0.0;
  local_18._begin = pfVar2;
  local_10 = puVar3;
  if (pfVar2 != pfVar1) {
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar4 == *puVar3) {
        *local_18._begin = *pfVar2 + *local_18._begin;
      }
      else {
        local_10 = local_10 + 1;
        local_4 = local_4 + *local_18._begin * *local_18._begin;
        local_18._begin[1] = *pfVar2;
        *local_10 = *puVar3;
        uVar4 = *puVar3;
        local_18._begin = local_18._begin + 1;
      }
      pfVar2 = pfVar2 + 1;
      puVar3 = puVar3 + 1;
    } while (pfVar2 != pfVar1);
  }
  local_4 = *local_18._begin * *local_18._begin + local_4;
  fs->sum_feat_sq = local_4;
  local_18._begin = local_18._begin + 1;
  local_10 = local_10 + 1;
  features::truncate_to(fs,&local_18);
  return local_4;
}

Assistant:

float collision_cleanup(features& fs)
{
  uint64_t last_index = (uint64_t)-1;
  float sum_sq = 0.f;
  features::iterator pos = fs.begin();
  for (features::iterator& f : fs)
  {
    if (last_index == f.index())
      pos.value() += f.value();
    else
    {
      sum_sq += pos.value() * pos.value();
      ++pos;
      pos.value() = f.value();
      pos.index() = f.index();
      last_index = f.index();
    }
  }

  sum_sq += pos.value() * pos.value();
  fs.sum_feat_sq = sum_sq;
  ++pos;
  fs.truncate_to(pos);

  return sum_sq;
}